

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentalProcessPdu.cpp
# Opt level: O0

void __thiscall
DIS::EnvironmentalProcessPdu::unmarshal(EnvironmentalProcessPdu *this,DataStream *dataStream)

{
  undefined1 local_38 [8];
  Environment x;
  size_t idx;
  DataStream *dataStream_local;
  EnvironmentalProcessPdu *this_local;
  
  SyntheticEnvironmentFamilyPdu::unmarshal(&this->super_SyntheticEnvironmentFamilyPdu,dataStream);
  EntityID::unmarshal(&this->_environementalProcessID,dataStream);
  EntityType::unmarshal(&this->_environmentType,dataStream);
  DataStream::operator>>(dataStream,&this->_modelType);
  DataStream::operator>>(dataStream,&this->_environmentStatus);
  DataStream::operator>>(dataStream,&this->_numberOfEnvironmentRecords);
  DataStream::operator>>(dataStream,&this->_sequenceNumber);
  std::vector<DIS::Environment,_std::allocator<DIS::Environment>_>::clear
            (&this->_environmentRecords);
  x._padding2 = '\0';
  x._17_7_ = 0;
  for (; (ulong)x._16_8_ < (ulong)this->_numberOfEnvironmentRecords; x._16_8_ = x._16_8_ + 1) {
    Environment::Environment((Environment *)local_38);
    Environment::unmarshal((Environment *)local_38,dataStream);
    std::vector<DIS::Environment,_std::allocator<DIS::Environment>_>::push_back
              (&this->_environmentRecords,(value_type *)local_38);
    Environment::~Environment((Environment *)local_38);
  }
  return;
}

Assistant:

void EnvironmentalProcessPdu::unmarshal(DataStream& dataStream)
{
    SyntheticEnvironmentFamilyPdu::unmarshal(dataStream); // unmarshal information in superclass first
    _environementalProcessID.unmarshal(dataStream);
    _environmentType.unmarshal(dataStream);
    dataStream >> _modelType;
    dataStream >> _environmentStatus;
    dataStream >> _numberOfEnvironmentRecords;
    dataStream >> _sequenceNumber;

     _environmentRecords.clear();
     for(size_t idx = 0; idx < _numberOfEnvironmentRecords; idx++)
     {
        Environment x;
        x.unmarshal(dataStream);
        _environmentRecords.push_back(x);
     }
}